

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ctor.hpp
# Opt level: O1

void __thiscall
njoy::ENDFtk::section::Type<15>::PartialDistribution::
PartialDistribution<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
          (PartialDistribution *this,
          __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *begin,__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *end,long *lineNumber,int MAT,int MF,int MT)

{
  undefined4 in_register_00000084;
  int in_stack_fffffffffffffee0;
  PartialDistribution local_118;
  
  readPartialDistribution<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
            (&local_118,(PartialDistribution *)begin,end,
             (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)lineNumber,(long *)CONCAT44(in_register_00000084,MAT),MF,MT,
             in_stack_fffffffffffffee0);
  *(_Head_base<5UL,_long,_false> *)
   &(this->probability_).super_TabulationRecord.super_InterpolationBase.metadata.fields.
    super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
    super__Tuple_impl<1UL,_double,_long,_long,_long,_long> =
       local_118.probability_.super_TabulationRecord.super_InterpolationBase.metadata.fields.
       super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
       super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
       super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
       super__Tuple_impl<4UL,_long,_long>.super__Tuple_impl<5UL,_long>.
       super__Head_base<5UL,_long,_false>._M_head_impl;
  ((_Head_base<4UL,_long,_false> *)
  ((long)&(this->probability_).super_TabulationRecord.super_InterpolationBase.metadata.fields.
          super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
          super__Tuple_impl<1UL,_double,_long,_long,_long,_long> + 8))->_M_head_impl =
       local_118.probability_.super_TabulationRecord.super_InterpolationBase.metadata.fields.
       super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
       super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
       super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
       super__Tuple_impl<4UL,_long,_long>.super__Head_base<4UL,_long,_false>._M_head_impl;
  ((_Head_base<3UL,_long,_false> *)
  ((long)&(this->probability_).super_TabulationRecord.super_InterpolationBase.metadata.fields.
          super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
          super__Tuple_impl<1UL,_double,_long,_long,_long,_long> + 0x10))->_M_head_impl =
       local_118.probability_.super_TabulationRecord.super_InterpolationBase.metadata.fields.
       super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
       super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
       super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
       super__Head_base<3UL,_long,_false>._M_head_impl;
  ((_Head_base<2UL,_long,_false> *)
  ((long)&(this->probability_).super_TabulationRecord.super_InterpolationBase.metadata.fields.
          super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
          super__Tuple_impl<1UL,_double,_long,_long,_long,_long> + 0x18))->_M_head_impl =
       local_118.probability_.super_TabulationRecord.super_InterpolationBase.metadata.fields.
       super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
       super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
       super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Head_base<2UL,_long,_false>.
       _M_head_impl;
  ((_Head_base<1UL,_double,_false> *)
  ((long)&(this->probability_).super_TabulationRecord.super_InterpolationBase.metadata.fields.
          super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
          super__Tuple_impl<1UL,_double,_long,_long,_long,_long> + 0x20))->_M_head_impl =
       local_118.probability_.super_TabulationRecord.super_InterpolationBase.metadata.fields.
       super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
       super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.super__Head_base<1UL,_double,_false>.
       _M_head_impl;
  (this->probability_).super_TabulationRecord.super_InterpolationBase.metadata.fields.
  super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Head_base<0UL,_double,_false>._M_head_impl =
       local_118.probability_.super_TabulationRecord.super_InterpolationBase.metadata.fields.
       super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
       super__Head_base<0UL,_double,_false>._M_head_impl;
  (this->probability_).super_TabulationRecord.super_InterpolationBase.boundaryIndices.
  super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_start =
       local_118.probability_.super_TabulationRecord.super_InterpolationBase.boundaryIndices.
       super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_start;
  *(pointer *)
   ((long)&(this->probability_).super_TabulationRecord.super_InterpolationBase.boundaryIndices.
           super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data + 8) =
       local_118.probability_.super_TabulationRecord.super_InterpolationBase.boundaryIndices.
       super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_finish;
  *(pointer *)
   ((long)&(this->probability_).super_TabulationRecord.super_InterpolationBase.boundaryIndices.
           super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data + 0x10) =
       local_118.probability_.super_TabulationRecord.super_InterpolationBase.boundaryIndices.
       super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
       _M_end_of_storage;
  local_118.probability_.super_TabulationRecord.super_InterpolationBase.boundaryIndices.
  super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_end_of_storage
       = (pointer)0x0;
  local_118.probability_.super_TabulationRecord.super_InterpolationBase.boundaryIndices.
  super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  local_118.probability_.super_TabulationRecord.super_InterpolationBase.boundaryIndices.
  super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  (this->probability_).super_TabulationRecord.super_InterpolationBase.interpolationSchemeIndices.
  super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_start =
       local_118.probability_.super_TabulationRecord.super_InterpolationBase.
       interpolationSchemeIndices.super__Vector_base<long,_std::allocator<long>_>._M_impl.
       super__Vector_impl_data._M_start;
  *(pointer *)
   ((long)&(this->probability_).super_TabulationRecord.super_InterpolationBase.
           interpolationSchemeIndices.super__Vector_base<long,_std::allocator<long>_>._M_impl.
           super__Vector_impl_data + 8) =
       local_118.probability_.super_TabulationRecord.super_InterpolationBase.
       interpolationSchemeIndices.super__Vector_base<long,_std::allocator<long>_>._M_impl.
       super__Vector_impl_data._M_finish;
  *(pointer *)
   ((long)&(this->probability_).super_TabulationRecord.super_InterpolationBase.
           interpolationSchemeIndices.super__Vector_base<long,_std::allocator<long>_>._M_impl.
           super__Vector_impl_data + 0x10) =
       local_118.probability_.super_TabulationRecord.super_InterpolationBase.
       interpolationSchemeIndices.super__Vector_base<long,_std::allocator<long>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  local_118.probability_.super_TabulationRecord.super_InterpolationBase.interpolationSchemeIndices.
  super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_end_of_storage
       = (pointer)0x0;
  local_118.probability_.super_TabulationRecord.super_InterpolationBase.interpolationSchemeIndices.
  super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  local_118.probability_.super_TabulationRecord.super_InterpolationBase.interpolationSchemeIndices.
  super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  (this->probability_).super_TabulationRecord.xValues.
  super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start =
       local_118.probability_.super_TabulationRecord.xValues.
       super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start;
  (this->probability_).super_TabulationRecord.xValues.
  super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_finish =
       local_118.probability_.super_TabulationRecord.xValues.
       super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_finish
  ;
  (this->probability_).super_TabulationRecord.xValues.
  super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage =
       local_118.probability_.super_TabulationRecord.xValues.
       super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
       _M_end_of_storage;
  local_118.probability_.super_TabulationRecord.xValues.
  super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_118.probability_.super_TabulationRecord.xValues.
  super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  local_118.probability_.super_TabulationRecord.xValues.
  super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  (this->probability_).super_TabulationRecord.yValues.
  super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start =
       local_118.probability_.super_TabulationRecord.yValues.
       super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start;
  (this->probability_).super_TabulationRecord.yValues.
  super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_finish =
       local_118.probability_.super_TabulationRecord.yValues.
       super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_finish
  ;
  (this->probability_).super_TabulationRecord.yValues.
  super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage =
       local_118.probability_.super_TabulationRecord.yValues.
       super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
       _M_end_of_storage;
  local_118.probability_.super_TabulationRecord.yValues.
  super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_118.probability_.super_TabulationRecord.yValues.
  super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  local_118.probability_.super_TabulationRecord.yValues.
  super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  *(_Head_base<5UL,_long,_false> *)
   &(this->distribution_).data_.interpolation_.super_InterpolationBase.metadata.fields.
    super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
    super__Tuple_impl<1UL,_double,_long,_long,_long,_long> =
       local_118.distribution_.data_.interpolation_.super_InterpolationBase.metadata.fields.
       super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
       super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
       super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
       super__Tuple_impl<4UL,_long,_long>.super__Tuple_impl<5UL,_long>.
       super__Head_base<5UL,_long,_false>._M_head_impl;
  ((_Head_base<4UL,_long,_false> *)
  ((long)&(this->distribution_).data_.interpolation_.super_InterpolationBase.metadata.fields.
          super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long> + 8))->_M_head_impl =
       local_118.distribution_.data_.interpolation_.super_InterpolationBase.metadata.fields.
       super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
       super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
       super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
       super__Tuple_impl<4UL,_long,_long>.super__Head_base<4UL,_long,_false>._M_head_impl;
  ((_Head_base<3UL,_long,_false> *)
  ((long)&(this->distribution_).data_.interpolation_.super_InterpolationBase.metadata.fields.
          super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long> + 0x10))->_M_head_impl =
       local_118.distribution_.data_.interpolation_.super_InterpolationBase.metadata.fields.
       super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
       super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
       super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
       super__Head_base<3UL,_long,_false>._M_head_impl;
  ((_Head_base<2UL,_long,_false> *)
  ((long)&(this->distribution_).data_.interpolation_.super_InterpolationBase.metadata.fields.
          super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long> + 0x18))->_M_head_impl =
       local_118.distribution_.data_.interpolation_.super_InterpolationBase.metadata.fields.
       super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
       super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
       super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Head_base<2UL,_long,_false>.
       _M_head_impl;
  ((_Head_base<1UL,_double,_false> *)
  ((long)&(this->distribution_).data_.interpolation_.super_InterpolationBase.metadata.fields.
          super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long> + 0x20))->_M_head_impl =
       local_118.distribution_.data_.interpolation_.super_InterpolationBase.metadata.fields.
       super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
       super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.super__Head_base<1UL,_double,_false>.
       _M_head_impl;
  ((_Head_base<0UL,_double,_false> *)
  ((long)&(this->distribution_).data_.interpolation_.super_InterpolationBase.metadata.fields.
          super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long> + 0x28))->_M_head_impl =
       local_118.distribution_.data_.interpolation_.super_InterpolationBase.metadata.fields.
       super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
       super__Head_base<0UL,_double,_false>._M_head_impl;
  (this->distribution_).data_.interpolation_.super_InterpolationBase.boundaryIndices.
  super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_start =
       local_118.distribution_.data_.interpolation_.super_InterpolationBase.boundaryIndices.
       super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_start;
  *(pointer *)
   ((long)&(this->distribution_).data_.interpolation_.super_InterpolationBase.boundaryIndices.
           super__Vector_base<long,_std::allocator<long>_>._M_impl + 8) =
       local_118.distribution_.data_.interpolation_.super_InterpolationBase.boundaryIndices.
       super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_finish;
  *(pointer *)
   ((long)&(this->distribution_).data_.interpolation_.super_InterpolationBase.boundaryIndices.
           super__Vector_base<long,_std::allocator<long>_>._M_impl + 0x10) =
       local_118.distribution_.data_.interpolation_.super_InterpolationBase.boundaryIndices.
       super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
       _M_end_of_storage;
  local_118.distribution_.data_.interpolation_.super_InterpolationBase.boundaryIndices.
  super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_end_of_storage
       = (pointer)0x0;
  local_118.distribution_.data_.interpolation_.super_InterpolationBase.boundaryIndices.
  super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  local_118.distribution_.data_.interpolation_.super_InterpolationBase.boundaryIndices.
  super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  (this->distribution_).data_.interpolation_.super_InterpolationBase.interpolationSchemeIndices.
  super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_start =
       local_118.distribution_.data_.interpolation_.super_InterpolationBase.
       interpolationSchemeIndices.super__Vector_base<long,_std::allocator<long>_>._M_impl.
       super__Vector_impl_data._M_start;
  *(pointer *)
   ((long)&(this->distribution_).data_.interpolation_.super_InterpolationBase.
           interpolationSchemeIndices.super__Vector_base<long,_std::allocator<long>_>._M_impl + 8) =
       local_118.distribution_.data_.interpolation_.super_InterpolationBase.
       interpolationSchemeIndices.super__Vector_base<long,_std::allocator<long>_>._M_impl.
       super__Vector_impl_data._M_finish;
  *(pointer *)
   ((long)&(this->distribution_).data_.interpolation_.super_InterpolationBase.
           interpolationSchemeIndices.super__Vector_base<long,_std::allocator<long>_>._M_impl + 0x10
   ) = local_118.distribution_.data_.interpolation_.super_InterpolationBase.
       interpolationSchemeIndices.super__Vector_base<long,_std::allocator<long>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  local_118.distribution_.data_.interpolation_.super_InterpolationBase.interpolationSchemeIndices.
  super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_end_of_storage
       = (pointer)0x0;
  local_118.distribution_.data_.interpolation_.super_InterpolationBase.interpolationSchemeIndices.
  super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  local_118.distribution_.data_.interpolation_.super_InterpolationBase.interpolationSchemeIndices.
  super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  (this->distribution_).data_.sequence_.
  super__Vector_base<njoy::ENDFtk::section::Type<15>::TabulatedSpectrum::OutgoingEnergyDistribution,_std::allocator<njoy::ENDFtk::section::Type<15>::TabulatedSpectrum::OutgoingEnergyDistribution>_>
  ._M_impl.super__Vector_impl_data._M_start =
       local_118.distribution_.data_.sequence_.
       super__Vector_base<njoy::ENDFtk::section::Type<15>::TabulatedSpectrum::OutgoingEnergyDistribution,_std::allocator<njoy::ENDFtk::section::Type<15>::TabulatedSpectrum::OutgoingEnergyDistribution>_>
       ._M_impl.super__Vector_impl_data._M_start;
  (this->distribution_).data_.sequence_.
  super__Vector_base<njoy::ENDFtk::section::Type<15>::TabulatedSpectrum::OutgoingEnergyDistribution,_std::allocator<njoy::ENDFtk::section::Type<15>::TabulatedSpectrum::OutgoingEnergyDistribution>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       local_118.distribution_.data_.sequence_.
       super__Vector_base<njoy::ENDFtk::section::Type<15>::TabulatedSpectrum::OutgoingEnergyDistribution,_std::allocator<njoy::ENDFtk::section::Type<15>::TabulatedSpectrum::OutgoingEnergyDistribution>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  (this->distribution_).data_.sequence_.
  super__Vector_base<njoy::ENDFtk::section::Type<15>::TabulatedSpectrum::OutgoingEnergyDistribution,_std::allocator<njoy::ENDFtk::section::Type<15>::TabulatedSpectrum::OutgoingEnergyDistribution>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       local_118.distribution_.data_.sequence_.
       super__Vector_base<njoy::ENDFtk::section::Type<15>::TabulatedSpectrum::OutgoingEnergyDistribution,_std::allocator<njoy::ENDFtk::section::Type<15>::TabulatedSpectrum::OutgoingEnergyDistribution>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_118.distribution_.data_.sequence_.
  super__Vector_base<njoy::ENDFtk::section::Type<15>::TabulatedSpectrum::OutgoingEnergyDistribution,_std::allocator<njoy::ENDFtk::section::Type<15>::TabulatedSpectrum::OutgoingEnergyDistribution>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_118.distribution_.data_.sequence_.
  super__Vector_base<njoy::ENDFtk::section::Type<15>::TabulatedSpectrum::OutgoingEnergyDistribution,_std::allocator<njoy::ENDFtk::section::Type<15>::TabulatedSpectrum::OutgoingEnergyDistribution>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_118.distribution_.data_.sequence_.
  super__Vector_base<njoy::ENDFtk::section::Type<15>::TabulatedSpectrum::OutgoingEnergyDistribution,_std::allocator<njoy::ENDFtk::section::Type<15>::TabulatedSpectrum::OutgoingEnergyDistribution>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  ~PartialDistribution(&local_118);
  return;
}

Assistant:

PartialDistribution( Iterator& begin,
                     const Iterator& end,
                     long& lineNumber,
                     int MAT,
                     int MF,
                     int MT ) :
  PartialDistribution( readPartialDistribution( begin, end, lineNumber,
                                                MAT, MF, MT ) ) {}